

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_block_statemach(connectdata *conn)

{
  CURLcode CVar1;
  
  CVar1 = CURLE_OK;
  while (((conn->proto).imapc.state != IMAP_STOP && (CVar1 == CURLE_OK))) {
    CVar1 = Curl_pp_statemach(&(conn->proto).ftpc.pp,true);
  }
  return CVar1;
}

Assistant:

static CURLcode smtp_block_statemach(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  while(smtpc->state != SMTP_STOP && !result)
    result = Curl_pp_statemach(&smtpc->pp, TRUE);

  return result;
}